

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O1

DArray<int> *
Kernel::PrecedenceOrdering::funcPrecFromOpts
          (DArray<int> *__return_storage_ptr__,Problem *prb,Options *opt)

{
  int *piVar1;
  undefined1 auVar2 [12];
  char cVar3;
  istream *piVar4;
  ulong uVar5;
  uint *res;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  DArray<unsigned_int> aux;
  string precedence;
  ifstream precedence_file;
  DArray<unsigned_int> local_268;
  string local_250;
  long local_230 [65];
  
  uVar7 = (ulong)(*(long *)(DAT_00b7e1b0 + 0x68) - *(long *)(DAT_00b7e1b0 + 0x60)) >> 3;
  uVar8 = uVar7 & 0xffffffff;
  local_268._size = uVar8;
  local_268._capacity = uVar8;
  if (uVar8 == 0) {
    local_268._array = (uint *)0x0;
  }
  else {
    uVar5 = uVar8 * 4 + 0xf & 0x7fffffff0;
    if (uVar5 == 0) {
      local_268._array =
           (uint *)::Lib::FixedSizeAllocator<8UL>::alloc
                             ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar5 < 0x11) {
      local_268._array =
           (uint *)::Lib::FixedSizeAllocator<16UL>::alloc
                             ((FixedSizeAllocator<16UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar5 < 0x19) {
      local_268._array =
           (uint *)::Lib::FixedSizeAllocator<24UL>::alloc
                             ((FixedSizeAllocator<24UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar5 < 0x21) {
      local_268._array =
           (uint *)::Lib::FixedSizeAllocator<32UL>::alloc
                             ((FixedSizeAllocator<32UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar5 < 0x31) {
      local_268._array =
           (uint *)::Lib::FixedSizeAllocator<48UL>::alloc
                             ((FixedSizeAllocator<48UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar5 < 0x41) {
      local_268._array =
           (uint *)::Lib::FixedSizeAllocator<64UL>::alloc
                             ((FixedSizeAllocator<64UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_268._array = (uint *)::operator_new(uVar5,0x10);
    }
    if (local_268._capacity != 0) {
      memset(local_268._array,0,local_268._capacity << 2);
    }
  }
  uVar6 = (uint)uVar7;
  if (uVar6 != 0) {
    auVar2._4_8_ = 0;
    auVar2._0_4_ = uVar6;
    ::Lib::DArray<unsigned_int>::initFromIterator<Lib::RangeIterator<unsigned_int>>
              (&local_268,(RangeIterator<unsigned_int>)(auVar2 << 0x40),uVar8);
    if ((opt->_functionPrecedence).
        super_OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .actualValue._M_string_length == 0) {
      sortAuxBySymbolPrecedence(&local_268,opt,FUNC);
    }
    else {
      local_250._M_string_length = 0;
      local_250.field_2._M_local_buf[0] = '\0';
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::ifstream::ifstream
                (local_230,
                 (opt->_functionPrecedence).
                 super_OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .actualValue._M_dataplus._M_p,_S_in);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 != '\0') {
        cVar3 = std::ios::widen((char)local_230 + (char)*(undefined8 *)(local_230[0] + -0x18));
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_230,(string *)&local_250,cVar3);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
          loadPermutationFromString(&local_268,&local_250);
          std::ifstream::close();
        }
      }
      std::ifstream::~ifstream(local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,
                        CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                                 local_250.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  ::Lib::DArray<int>::DArray(__return_storage_ptr__,uVar8);
  if (uVar6 != 0) {
    piVar1 = __return_storage_ptr__->_array;
    uVar8 = 0;
    do {
      piVar1[local_268._array[uVar8]] = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while ((uVar7 & 0xffffffff) != uVar8);
  }
  if (local_268._array != (uint *)0x0) {
    uVar7 = local_268._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      *(undefined8 *)local_268._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_268._array;
    }
    else if (uVar7 < 0x11) {
      *(undefined8 *)local_268._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_268._array;
    }
    else if (uVar7 < 0x19) {
      *(undefined8 *)local_268._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_268._array;
    }
    else if (uVar7 < 0x21) {
      *(undefined8 *)local_268._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_268._array;
    }
    else if (uVar7 < 0x31) {
      *(undefined8 *)local_268._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_268._array;
    }
    else if (uVar7 < 0x41) {
      *(undefined8 *)local_268._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_268._array;
    }
    else {
      operator_delete(local_268._array,0x10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DArray<int> PrecedenceOrdering::funcPrecFromOpts(Problem& prb, const Options& opt) {
  unsigned nFunctions = env.signature->functions();
  DArray<unsigned> aux(nFunctions);

  if(nFunctions) {
    aux.initFromIterator(getRangeIterator(0u, nFunctions), nFunctions);

    if (!opt.functionPrecedence().empty()) {
      std::string precedence;
      ifstream precedence_file (opt.functionPrecedence().c_str());
      if (precedence_file.is_open() && getline(precedence_file, precedence)) {
        loadPermutationFromString(aux,precedence);
        precedence_file.close();
      }
    } else {
      sortAuxBySymbolPrecedence(aux,opt,SymbolType::FUNC);
    }
  }

  DArray<int>  functionPrecedences(nFunctions);
  for(unsigned i=0;i<nFunctions;i++) {
    functionPrecedences[aux[i]]=i;
  }
  return functionPrecedences;
}